

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

bool __thiscall
google::protobuf::internal::KeyMapBase<bool>::InsertOrReplaceNode
          (KeyMapBase<bool> *this,KeyNode *node)

{
  bool bVar1;
  map_index_t b;
  NodeBase *node_00;
  NodeAndBucket NVar2;
  
  NVar2 = FindHelper(this,(ViewType)(*(byte *)&node[1].super_NodeBase.next & 1));
  node_00 = NVar2.node;
  b = NVar2.bucket;
  if (node_00 == (NodeBase *)0x0) {
    bVar1 = ResizeIfLoadIsOutOfRange(this,(ulong)((this->super_UntypedMapBase).num_elements_ + 1));
    if (bVar1) {
      b = BucketNumber(this,(ViewType)(*(byte *)&node[1].super_NodeBase.next & 1));
    }
  }
  else {
    EraseImpl(this,b,(KeyNode *)node_00,true);
  }
  InsertUnique(this,b,node);
  (this->super_UntypedMapBase).num_elements_ = (this->super_UntypedMapBase).num_elements_ + 1;
  return node_00 == (NodeBase *)0x0;
}

Assistant:

bool InsertOrReplaceNode(KeyNode* node) {
    bool is_new = true;
    auto p = this->FindHelper(node->key());
    map_index_t b = p.bucket;
    if (ABSL_PREDICT_FALSE(p.node != nullptr)) {
      EraseImpl(p.bucket, static_cast<KeyNode*>(p.node), true);
      is_new = false;
    } else if (ResizeIfLoadIsOutOfRange(num_elements_ + 1)) {
      b = BucketNumber(node->key());  // bucket_number
    }
    InsertUnique(b, node);
    ++num_elements_;
    return is_new;
  }